

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall Memory::Recycler::SetDisableConcurrentThreadExitedCheck(Recycler *this)

{
  Recycler *this_local;
  
  this->disableConcurrentThreadExitedCheck = true;
  this->recyclerStress = false;
  this->recyclerBackgroundStress = false;
  this->recyclerConcurrentStress = false;
  this->recyclerConcurrentRepeatStress = false;
  this->recyclerPartialStress = false;
  return;
}

Assistant:

void
Recycler::SetDisableConcurrentThreadExitedCheck()
{
#if ENABLE_CONCURRENT_GC
    disableConcurrentThreadExitedCheck = true;
#endif
#ifdef RECYCLER_STRESS
    this->recyclerStress = false;
#if ENABLE_CONCURRENT_GC
    this->recyclerBackgroundStress = false;
    this->recyclerConcurrentStress = false;
    this->recyclerConcurrentRepeatStress = false;
#endif
#if ENABLE_PARTIAL_GC
    this->recyclerPartialStress = false;
#endif
#endif
}